

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.hpp
# Opt level: O0

string * __thiscall
toml::detail::
make_string<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
          (string *__return_storage_ptr__,detail *this,
          __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> first,
          __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> last)

{
  bool bVar1;
  allocator<char> local_49;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_48;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_40;
  allocator<char> local_21;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_20;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> last_local;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> first_local;
  
  local_20._M_current = first._M_current;
  last_local._M_current = (char *)this;
  bVar1 = __gnu_cxx::operator==(&last_local,&local_20);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_21);
    std::allocator<char>::~allocator(&local_21);
  }
  else {
    local_40._M_current = last_local._M_current;
    local_48._M_current = local_20._M_current;
    std::allocator<char>::allocator();
    std::__cxx11::string::
    string<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,void>
              ((string *)__return_storage_ptr__,local_40,local_48,&local_49);
    std::allocator<char>::~allocator(&local_49);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string make_string(Iterator first, Iterator last)
{
    if(first == last) {return "";}
    return std::string(first, last);
}